

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Product<Eigen::SparseMatrix<float,0,int>,Eigen::Matrix<float,_1,1,0,_1,1>,0>const,Eigen::Matrix<float,_1,1,0,_1,1>const>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,__1,__1,_0,__1,__1> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
               *src,assign_op<float,_float> *func)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ulong uVar12;
  long lVar13;
  SrcEvaluatorType srcEvaluator;
  product_evaluator<Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::SparseShape,_Eigen::DenseShape,_float,_float>
  local_38;
  float *local_20;
  
  product_evaluator<Eigen::Product<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>,_7,_Eigen::SparseShape,_Eigen::DenseShape,_float,_float>
  ::product_evaluator(&local_38,&src->m_lhs);
  local_20 = (src->m_rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
  uVar12 = (src->m_rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       uVar12) ||
     ((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 1))
  {
    if ((long)uVar12 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1>]"
                   );
    }
    DenseStorage<float,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<float,__1,__1,__1,_0> *)dst,uVar12,uVar12,1);
  }
  uVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((uVar4 == uVar12) &&
     ((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols == 1))
  {
    pfVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data
    ;
    uVar12 = uVar4 + 3;
    if (-1 < (long)uVar4) {
      uVar12 = uVar4;
    }
    uVar12 = uVar12 & 0xfffffffffffffffc;
    if (3 < (long)uVar4) {
      lVar13 = 0;
      do {
        pfVar1 = (float *)((long)local_38.super_evaluator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                 super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                                 .m_d.data + lVar13 * 4);
        fVar6 = pfVar1[1];
        fVar7 = pfVar1[2];
        fVar8 = pfVar1[3];
        pfVar2 = local_20 + lVar13;
        fVar9 = pfVar2[1];
        fVar10 = pfVar2[2];
        fVar11 = pfVar2[3];
        pfVar3 = pfVar5 + lVar13;
        *pfVar3 = *pfVar1 - *pfVar2;
        pfVar3[1] = fVar6 - fVar9;
        pfVar3[2] = fVar7 - fVar10;
        pfVar3[3] = fVar8 - fVar11;
        lVar13 = lVar13 + 4;
      } while (lVar13 < (long)uVar12);
    }
    if ((long)uVar12 < (long)uVar4) {
      do {
        pfVar5[uVar12] =
             *(float *)((long)local_38.super_evaluator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                              .m_d.data + uVar12 * 4) - local_20[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar4 != uVar12);
    }
    free(local_38.m_result.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, -1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Product<Eigen::SparseMatrix<float>, Eigen::Matrix<float, -1, 1>>, const Eigen::Matrix<float, -1, 1>>, T1 = float, T2 = float]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}